

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O1

bool EDCircles::CircleFit(double *x,double *y,int N,double *pxc,double *pyc,double *pr,double *pe)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  *pe = 1e+20;
  if (N < 3) {
    bVar1 = false;
  }
  else {
    dVar15 = 0.0;
    uVar2 = 0;
    dVar14 = 0.0;
    do {
      dVar15 = dVar15 + x[uVar2];
      dVar14 = dVar14 + y[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)N != uVar2);
    dVar4 = (double)N;
    dVar6 = 0.0;
    uVar2 = 0;
    dVar7 = 0.0;
    dVar5 = 0.0;
    dVar10 = 0.0;
    dVar16 = 0.0;
    dVar9 = 0.0;
    dVar8 = 0.0;
    do {
      dVar11 = x[uVar2] - dVar15 / dVar4;
      dVar12 = y[uVar2] - dVar14 / dVar4;
      dVar6 = dVar6 + dVar11 * dVar11;
      dVar13 = dVar11 * dVar12;
      dVar7 = dVar7 + dVar13;
      dVar5 = dVar5 + dVar12 * dVar12;
      dVar10 = dVar10 + dVar11 * dVar11 * dVar11;
      dVar16 = dVar16 + dVar13 * dVar12;
      dVar9 = dVar9 + dVar12 * dVar12 * dVar12;
      dVar8 = dVar8 + dVar13 * dVar11;
      uVar2 = uVar2 + 1;
    } while ((uint)N != uVar2);
    dVar11 = dVar6 * dVar5 - dVar7 * dVar7;
    if ((dVar11 != 0.0) || (NAN(dVar11))) {
      dVar10 = (dVar16 + dVar10) * 0.5;
      dVar8 = (dVar8 + dVar9) * 0.5;
      dVar9 = (dVar5 * dVar10 + dVar8 * -dVar7) / dVar11;
      dVar11 = (dVar10 * -dVar7 + dVar6 * dVar8) / dVar11;
      dVar5 = (dVar5 + dVar6) / dVar4 + dVar9 * dVar9 + dVar11 * dVar11;
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      *pxc = dVar15 / dVar4 + dVar9;
      uVar2 = 1;
      if (1 < N) {
        uVar2 = (ulong)(uint)N;
      }
      *pyc = dVar14 / dVar4 + dVar11;
      uVar3 = 0;
      dVar14 = 0.0;
      do {
        dVar15 = (x[uVar3] - *pxc) * (x[uVar3] - *pxc) + (y[uVar3] - *pyc) * (y[uVar3] - *pyc);
        if (dVar15 < 0.0) {
          dVar15 = sqrt(dVar15);
        }
        else {
          dVar15 = SQRT(dVar15);
        }
        dVar14 = dVar14 + (dVar15 - dVar5) * (dVar15 - dVar5);
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
      *pr = dVar5;
      dVar14 = dVar14 / dVar4;
      if (dVar14 < 0.0) {
        dVar14 = sqrt(dVar14);
      }
      else {
        dVar14 = SQRT(dVar14);
      }
      *pe = dVar14;
      bVar1 = true;
    }
    else {
      bVar1 = (bool)(-(dVar11 != 0.0) & 1);
    }
  }
  return bVar1;
}

Assistant:

bool EDCircles::CircleFit(double * x, double * y, int N, double * pxc, double * pyc, double * pr, double * pe)
{
	*pe = 1e20;
	if (N < 3) return false;

	double xAvg = 0;
	double yAvg = 0;

	for (int i = 0; i<N; i++) {
		xAvg += x[i];
		yAvg += y[i];
	} //end-for

	xAvg /= N;
	yAvg /= N;

	double Suu = 0;
	double Suv = 0;
	double Svv = 0;
	double Suuu = 0;
	double Suvv = 0;
	double Svvv = 0;
	double Svuu = 0;
	for (int i = 0; i<N; i++) {
		double u = x[i] - xAvg;
		double v = y[i] - yAvg;

		Suu += u*u;
		Suv += u*v;
		Svv += v*v;
		Suuu += u*u*u;
		Suvv += u*v*v;
		Svvv += v*v*v;
		Svuu += v*u*u;
	} //end-for

	  // Now, we solve for the following linear system of equations
	  // Av = b, where v = (uc, vc) is the center of the circle
	  //
	  // |N    Suv| |uc| = |b1|
	  // |Suv  Svv| |vc| = |b2|
	  //
	  // where b1 = 0.5*(Suuu+Suvv) and b2 = 0.5*(Svvv+Svuu)
	  //
	double detA = Suu*Svv - Suv*Suv;
	if (detA == 0) return false;

	double b1 = 0.5*(Suuu + Suvv);
	double b2 = 0.5*(Svvv + Svuu);

	double uc = (Svv*b1 - Suv*b2) / detA;
	double vc = (Suu*b2 - Suv*b1) / detA;

	double R = sqrt(uc*uc + vc*vc + (Suu + Svv) / N);

	*pxc = uc + xAvg;
	*pyc = vc + yAvg;

	// Compute mean square error
	double error = 0;
	for (int i = 0; i<N; i++) {
		double dx = x[i] - *pxc;
		double dy = y[i] - *pyc;
		double d = sqrt(dx*dx + dy*dy) - R;
		error += d*d;
	} //end-for

	*pr = R;
	*pe = sqrt(error / N);

	return true;
}